

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBackCompatBlosc.cpp
# Opt level: O3

void __thiscall
adios2::format::BPBackCompatBlosc::GetData
          (BPBackCompatBlosc *this,char *input,BlockOperationInfo *blockOperationInfo,
          char *dataOutput)

{
  runtime_error *this_00;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "ERROR: current ADIOS2 library didn\'t compile with Blosc, can\'t read Blosc compressed data, in call to Get\n"
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BPBackCompatBlosc::GetData(const char *input,
                                const helper::BlockOperationInfo &blockOperationInfo,
                                char *dataOutput) const
{
#ifdef ADIOS2_HAVE_BLOSC2
    core::compress::CompressBlosc op((Params()));
    const size_t sizeOut =
        (sizeof(size_t) == 8)
            ? static_cast<size_t>(helper::StringTo<uint64_t>(
                  blockOperationInfo.Info.at("InputSize"), "when reading Blosc input size"))
            : static_cast<size_t>(helper::StringTo<uint32_t>(
                  blockOperationInfo.Info.at("InputSize"), "when reading Blosc input size"));

    Params &info = const_cast<Params &>(blockOperationInfo.Info);
    Decompress(input, blockOperationInfo.PayloadSize, dataOutput, sizeOut, info);

#else
    throw std::runtime_error("ERROR: current ADIOS2 library didn't compile "
                             "with Blosc, can't read Blosc compressed data, in call "
                             "to Get\n");
#endif
}